

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O3

string * __thiscall field::printPile_abi_cxx11_(string *__return_storage_ptr__,field *this)

{
  pointer pcVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  pointer pcVar5;
  long *local_78;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar5 = (this->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar5 != pcVar1) {
    do {
      pcVar2 = (pcVar5->name)._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + (pcVar5->name)._M_string_length);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x108149);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_68 = *plVar4;
        lStack_60 = plVar3[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar4;
        local_78 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (pcVar5->bolted == true) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string field::printPile() {
    string output;
    for(auto &card : field_) {
        output += "[" + card.getName();
        if (card.getBolted()) output += "(bolted)";
        output += "] ";
    }

    return output;
}